

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O2

ShaderProgram *
deqp::gles3::Functional::createIntUintPrecisionEvalProgram
          (RenderContext *context,DataType type,Precision precision,char *evalOp,bool isVertexCase)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  ostream *poVar4;
  ShaderProgram *this;
  char *pcVar5;
  ostringstream *poVar6;
  ostringstream frag;
  ostringstream vtx;
  string local_430;
  string local_410;
  ostream local_3f0;
  ostream local_278;
  ProgramSources local_100;
  
  pcVar1 = glu::getDataTypeName(type);
  pcVar2 = glu::getPrecisionName(precision);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3f0);
  poVar6 = (ostringstream *)&local_3f0;
  if (isVertexCase) {
    poVar6 = (ostringstream *)&local_278;
  }
  poVar3 = std::operator<<(&local_278,"#version 300 es\n");
  poVar3 = std::operator<<(poVar3,"in highp vec4 a_position;\n");
  poVar3 = std::operator<<(poVar3,"in ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  poVar3 = std::operator<<(poVar3," a_in0;\n");
  poVar3 = std::operator<<(poVar3,"in ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  std::operator<<(poVar3," a_in1;\n");
  poVar3 = std::operator<<(&local_3f0,"#version 300 es\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out ");
  poVar3 = std::operator<<(poVar3,pcVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,pcVar1);
  std::operator<<(poVar3," o_out;\n");
  if (isVertexCase) {
    poVar3 = std::operator<<(&local_278,"flat out ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    pcVar5 = " v_out;\n";
    std::operator<<(poVar3," v_out;\n");
    poVar3 = std::operator<<(&local_3f0,"flat in ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
  }
  else {
    poVar3 = std::operator<<(&local_278,"flat out ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3," v_in0;\n");
    poVar3 = std::operator<<(poVar3,"flat out ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    pcVar5 = " v_in1;\n";
    std::operator<<(poVar3," v_in1;\n");
    poVar3 = std::operator<<(&local_3f0,"flat in ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    poVar3 = std::operator<<(poVar3," v_in0;\n");
    poVar3 = std::operator<<(poVar3,"flat in ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,pcVar1);
  }
  std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(&local_278,"\nvoid main (void)\n{\n");
  std::operator<<(poVar3,"\tgl_Position = a_position;\n");
  poVar3 = &local_3f0;
  std::operator<<(poVar3,"\nvoid main (void)\n{\n");
  poVar4 = std::operator<<((ostream *)poVar6,"\t");
  poVar4 = std::operator<<(poVar4,pcVar2);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar1);
  poVar4 = std::operator<<(poVar4," in0 = ");
  pcVar5 = "a_";
  if (!isVertexCase) {
    pcVar5 = "v_";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4,"in0;\n");
  poVar4 = std::operator<<(poVar4,"\t");
  poVar4 = std::operator<<(poVar4,pcVar2);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar1);
  poVar4 = std::operator<<(poVar4," in1 = ");
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"in1;\n");
  poVar4 = std::operator<<((ostream *)poVar6,"\t");
  pcVar1 = "o_";
  if (isVertexCase) {
    pcVar1 = "v_";
  }
  poVar4 = std::operator<<(poVar4,pcVar1);
  poVar4 = std::operator<<(poVar4,"out = ");
  poVar4 = std::operator<<(poVar4,evalOp);
  std::operator<<(poVar4,";\n");
  if (isVertexCase) {
    pcVar1 = "\to_out = v_out;\n";
  }
  else {
    poVar3 = std::operator<<(&local_278,"\tv_in0 = a_in0;\n");
    pcVar1 = "\tv_in1 = a_in1;\n";
  }
  std::operator<<(poVar3,pcVar1);
  std::operator<<(&local_278,"}\n");
  std::operator<<(&local_3f0,"}\n");
  this = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  glu::makeVtxFragSources(&local_100,&local_410,&local_430);
  glu::ShaderProgram::ShaderProgram(this,context,&local_100);
  glu::ProgramSources::~ProgramSources(&local_100);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
  return this;
}

Assistant:

static glu::ShaderProgram* createIntUintPrecisionEvalProgram (const glu::RenderContext& context, glu::DataType type, glu::Precision precision, const char* evalOp, bool isVertexCase)
{
	const char*		typeName	= glu::getDataTypeName(type);
	const char*		precName	= glu::getPrecisionName(precision);
	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n"
		<< "in highp vec4 a_position;\n"
		<< "in " << precName << " " << typeName << " a_in0;\n"
		<< "in " << precName << " " << typeName << " a_in1;\n";
	frag << "#version 300 es\n"
		 << "layout(location = 0) out " << precName << " " << typeName << " o_out;\n";

	if (isVertexCase)
	{
		vtx << "flat out " << precName << " " << typeName << " v_out;\n";
		frag << "flat in " << precName << " " << typeName << " v_out;\n";
	}
	else
	{
		vtx << "flat out " << precName << " " << typeName << " v_in0;\n"
			<< "flat out " << precName << " " << typeName << " v_in1;\n";
		frag << "flat in " << precName << " " << typeName << " v_in0;\n"
			 << "flat in " << precName << " " << typeName << " v_in1;\n";
	}

	vtx << "\nvoid main (void)\n{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\nvoid main (void)\n{\n";

	op << "\t" << precName << " " << typeName << " in0 = " << (isVertexCase ? "a_" : "v_") << "in0;\n"
	   << "\t" << precName << " " << typeName << " in1 = " << (isVertexCase ? "a_" : "v_") << "in1;\n";

	op << "\t" << (isVertexCase ? "v_" : "o_") << "out = " << evalOp << ";\n";

	if (isVertexCase)
	{
		frag << "	o_out = v_out;\n";
	}
	else
	{
		vtx << "	v_in0 = a_in0;\n"
			<< "	v_in1 = a_in1;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	return new glu::ShaderProgram(context, glu::makeVtxFragSources(vtx.str(), frag.str()));
}